

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int deflateStateCheck(z_streamp strm)

{
  int iVar1;
  internal_state *piVar2;
  
  if ((((strm != (z_streamp)0x0) && (strm->zalloc != (alloc_func)0x0)) &&
      (strm->zfree != (free_func)0x0)) &&
     ((piVar2 = strm->state, piVar2 != (internal_state *)0x0 && (piVar2->strm == strm)))) {
    iVar1 = piVar2->status;
    if (((iVar1 - 0x39U < 0x39) &&
        ((0x100400400011001U >> ((ulong)(iVar1 - 0x39U) & 0x3f) & 1) != 0)) ||
       ((iVar1 == 0x29a || (iVar1 == 0x2a)))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

local int deflateStateCheck (strm)
    z_streamp strm;
{
    deflate_state *s;
    if (strm == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0)
        return 1;
    s = strm->state;
    if (s == Z_NULL || s->strm != strm || (s->status != INIT_STATE &&
#ifdef GZIP
                                           s->status != GZIP_STATE &&
#endif
                                           s->status != EXTRA_STATE &&
                                           s->status != NAME_STATE &&
                                           s->status != COMMENT_STATE &&
                                           s->status != HCRC_STATE &&
                                           s->status != BUSY_STATE &&
                                           s->status != FINISH_STATE))
        return 1;
    return 0;
}